

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O3

void __thiscall
icu_63::NFRule::doFormat
          (NFRule *this,int64_t number,UnicodeString *toInsertInto,int32_t pos,
          int32_t recursionCount,UErrorCode *status)

{
  UnicodeString *src;
  short sVar1;
  PluralFormat *this_00;
  NFSubstitution *pNVar2;
  uint srcLength;
  int32_t iVar3;
  int iVar4;
  uint64_t uVar5;
  uint uVar6;
  uint uVar7;
  undefined4 uVar8;
  uint start;
  int32_t iVar9;
  int iVar10;
  UnicodeString local_70;
  
  sVar1 = (this->fRuleText).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    srcLength = (this->fRuleText).fUnion.fFields.fLength;
  }
  else {
    srcLength = (int)sVar1 >> 5;
  }
  src = &this->fRuleText;
  if (this->rulePatternFormat == (PluralFormat *)0x0) {
    iVar10 = 0;
    UnicodeString::doReplace(toInsertInto,pos,0,src,0,srcLength);
  }
  else {
    uVar6 = (int)srcLength >> 0x1f & srcLength;
    srcLength = UnicodeString::indexOf(src,L"$(",0,-1,uVar6,srcLength - uVar6);
    sVar1 = (this->fRuleText).fUnion.fStackFields.fLengthAndFlags;
    if ((int)srcLength < 0) {
      uVar6 = (this->fRuleText).fUnion.fFields.fLength;
      start = 0;
    }
    else {
      uVar6 = (this->fRuleText).fUnion.fFields.fLength;
      start = (int)sVar1 >> 5;
      if (sVar1 < 0) {
        start = uVar6;
      }
      if ((int)srcLength <= (int)start) {
        start = srcLength;
      }
    }
    uVar7 = (int)sVar1 >> 5;
    if (sVar1 < 0) {
      uVar7 = uVar6;
    }
    iVar3 = UnicodeString::indexOf(src,L")$",0,-1,start,uVar7 - start);
    sVar1 = (toInsertInto->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar9 = (toInsertInto->fUnion).fFields.fLength;
    }
    else {
      iVar9 = (int)sVar1 >> 5;
    }
    sVar1 = (this->fRuleText).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar10 = (this->fRuleText).fUnion.fFields.fLength;
    }
    else {
      iVar10 = (int)sVar1 >> 5;
    }
    if (iVar3 < iVar10 + -1) {
      UnicodeString::tempSubString(&local_70,src,iVar3 + 2,0x7fffffff);
      uVar8 = local_70.fUnion.fFields.fLength;
      if (-1 < local_70.fUnion.fStackFields.fLengthAndFlags) {
        uVar8 = (int)local_70.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      UnicodeString::doReplace(toInsertInto,pos,0,&local_70,0,uVar8);
      UnicodeString::~UnicodeString(&local_70);
    }
    this_00 = this->rulePatternFormat;
    uVar5 = util64_pow(this->radix,this->exponent);
    PluralFormat::format(&local_70,this_00,(int32_t)((ulong)number / uVar5),status);
    uVar8 = local_70.fUnion.fFields.fLength;
    if (-1 < local_70.fUnion.fStackFields.fLengthAndFlags) {
      uVar8 = (int)local_70.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    UnicodeString::doReplace(toInsertInto,pos,0,&local_70,0,uVar8);
    UnicodeString::~UnicodeString(&local_70);
    if (0 < (int)srcLength) {
      UnicodeString::tempSubString(&local_70,src,0,srcLength);
      if (-1 < local_70.fUnion.fStackFields.fLengthAndFlags) {
        local_70.fUnion.fFields.fLength = (int)local_70.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      UnicodeString::doReplace(toInsertInto,pos,0,&local_70,0,local_70.fUnion.fFields.fLength);
      UnicodeString::~UnicodeString(&local_70);
    }
    sVar1 = (this->fRuleText).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar3 = (this->fRuleText).fUnion.fFields.fLength;
    }
    else {
      iVar3 = (int)sVar1 >> 5;
    }
    sVar1 = (toInsertInto->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar10 = (toInsertInto->fUnion).fFields.fLength;
    }
    else {
      iVar10 = (int)sVar1 >> 5;
    }
    iVar10 = (iVar3 + iVar9) - iVar10;
  }
  pNVar2 = this->sub2;
  if (pNVar2 != (NFSubstitution *)0x0) {
    iVar4 = 0;
    if ((int)srcLength < pNVar2->pos) {
      iVar4 = iVar10;
    }
    (*(pNVar2->super_UObject)._vptr_UObject[6])
              (pNVar2,number,toInsertInto,(ulong)(uint)(pos - iVar4),(ulong)(uint)recursionCount,
               status);
  }
  pNVar2 = this->sub1;
  if (pNVar2 != (NFSubstitution *)0x0) {
    iVar4 = 0;
    if ((int)srcLength < pNVar2->pos) {
      iVar4 = iVar10;
    }
    (*(pNVar2->super_UObject)._vptr_UObject[6])
              (pNVar2,number,toInsertInto,(ulong)(uint)(pos - iVar4),(ulong)(uint)recursionCount,
               status);
  }
  return;
}

Assistant:

void
NFRule::doFormat(int64_t number, UnicodeString& toInsertInto, int32_t pos, int32_t recursionCount, UErrorCode& status) const
{
    // first, insert the rule's rule text into toInsertInto at the
    // specified position, then insert the results of the substitutions
    // into the right places in toInsertInto (notice we do the
    // substitutions in reverse order so that the offsets don't get
    // messed up)
    int32_t pluralRuleStart = fRuleText.length();
    int32_t lengthOffset = 0;
    if (!rulePatternFormat) {
        toInsertInto.insert(pos, fRuleText);
    }
    else {
        pluralRuleStart = fRuleText.indexOf(gDollarOpenParenthesis, -1, 0);
        int pluralRuleEnd = fRuleText.indexOf(gClosedParenthesisDollar, -1, pluralRuleStart);
        int initialLength = toInsertInto.length();
        if (pluralRuleEnd < fRuleText.length() - 1) {
            toInsertInto.insert(pos, fRuleText.tempSubString(pluralRuleEnd + 2));
        }
        toInsertInto.insert(pos,
            rulePatternFormat->format((int32_t)(number/util64_pow(radix, exponent)), status));
        if (pluralRuleStart > 0) {
            toInsertInto.insert(pos, fRuleText.tempSubString(0, pluralRuleStart));
        }
        lengthOffset = fRuleText.length() - (toInsertInto.length() - initialLength);
    }

    if (sub2 != NULL) {
        sub2->doSubstitution(number, toInsertInto, pos - (sub2->getPos() > pluralRuleStart ? lengthOffset : 0), recursionCount, status);
    }
    if (sub1 != NULL) {
        sub1->doSubstitution(number, toInsertInto, pos - (sub1->getPos() > pluralRuleStart ? lengthOffset : 0), recursionCount, status);
    }
}